

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

void __thiscall
HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::Clear
          (HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *this,int value)

{
  SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  DictionaryStats *this_00;
  bool bVar2;
  uint uVar3;
  Type *pTVar4;
  byte local_59;
  Bucket<ObjTypeGuardBucket> *bucket;
  EditingIterator iter;
  bool first;
  SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *list;
  int value_local;
  HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *this_local;
  
  pSVar1 = this->table;
  uVar3 = Hash(this,value);
  iter.last._7_1_ = 1;
  SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
            ((EditingIterator *)&bucket,pSVar1 + uVar3);
  while( true ) {
    bVar2 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
            EditingIterator::Next((EditingIterator *)&bucket);
    if (!bVar2) {
      return;
    }
    pTVar4 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Iterator::
             Data((Iterator *)&bucket);
    if (pTVar4->value <= value) break;
    iter.last._7_1_ = 0;
  }
  if (pTVar4->value != value) {
    return;
  }
  SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
  RemoveCurrent((EditingIterator *)&bucket,this->alloc);
  if (this->stats == (DictionaryStats *)0x0) {
    return;
  }
  this_00 = this->stats;
  local_59 = 0;
  if ((iter.last._7_1_ & 1) != 0) {
    bVar2 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
            EditingIterator::Next((EditingIterator *)&bucket);
    local_59 = bVar2 ^ 0xff;
  }
  DictionaryStats::Remove(this_00,(bool)(local_59 & 1));
  return;
}

Assistant:

void Clear(int value)
    {
        SListBase<Bucket<T>> * list = &this->table[this->Hash(value)];

        // Assumes sorted lists
#if PROFILE_DICTIONARY
        bool first = true;
#endif
        FOREACH_SLISTBASE_ENTRY_EDITING(Bucket<T>, bucket, list, iter)
        {
            if (bucket.value <= value)
            {
                if (bucket.value == value)
                {
                    iter.RemoveCurrent(this->alloc);
#if PROFILE_DICTIONARY
                    if (stats)
                        stats->Remove(first && !(iter.Next()));
#endif
                }
                return;
            }
#if PROFILE_DICTIONARY
        first = false;
#endif
        } NEXT_SLISTBASE_ENTRY_EDITING;
    }